

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTransform.h
# Opt level: O2

ChVector<double> *
chrono::ChTransform<double>::TransformLocalToParent
          (ChVector<double> *local,ChVector<double> *origin,ChMatrix33<double> *alignment)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ChVector<double> *in_RDI;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  dVar1 = local->m_data[1];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local->m_data[0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local->m_data[2];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       dVar1 * (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
  auVar3 = vfmadd231sd_fma(auVar11,auVar9,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       dVar1 * (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar4 = vfmadd231sd_fma(auVar13,auVar9,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       dVar1 * (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
  auVar5 = vfmadd231sd_fma(auVar10,auVar9,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar3 = vfmadd231sd_fma(auVar3,auVar12,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar4 = vfmadd231sd_fma(auVar4,auVar12,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (alignment->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar5 = vfmadd231sd_fma(auVar5,auVar12,auVar8);
  dVar1 = origin->m_data[1];
  dVar2 = origin->m_data[2];
  in_RDI->m_data[0] = auVar3._0_8_ + origin->m_data[0];
  in_RDI->m_data[1] = auVar4._0_8_ + dVar1;
  in_RDI->m_data[2] = auVar5._0_8_ + dVar2;
  return in_RDI;
}

Assistant:

static ChVector<Real> TransformLocalToParent(
        const ChVector<Real>& local,       ///< point to transform, given in local coordinates
        const ChVector<Real>& origin,      ///< origin of frame respect to parent, in parent coords,
        const ChMatrix33<Real>& alignment  ///< rotation of frame respect to parent, in parent coords.
        ) {
        return ChVector<Real>(
            alignment(0, 0) * local.x() + alignment(0, 1) * local.y() + alignment(0, 2) * local.z() + origin.x(),
            alignment(1, 0) * local.x() + alignment(1, 1) * local.y() + alignment(1, 2) * local.z() + origin.y(),
            alignment(2, 0) * local.x() + alignment(2, 1) * local.y() + alignment(2, 2) * local.z() + origin.z());
    }